

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressSeqStore_singleBlock
                 (ZSTD_CCtx *zc,seqStore_t *seqStore,repcodes_t *dRep,repcodes_t *cRep,void *dst,
                 size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock,U32 isPartition)

{
  undefined1 uVar1;
  U32 UVar2;
  undefined8 uVar3;
  seqDef *psVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  U32 UVar6;
  U32 UVar7;
  uint uVar8;
  int iVar9;
  size_t err_code_1;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  size_t err_code;
  bool bVar15;
  bool bVar16;
  undefined8 in_stack_ffffffffffffff80;
  BYTE *op;
  repcodes_t dRepOriginal;
  
  iVar9 = (int)in_stack_ffffffffffffff80;
  UVar2 = dRep->rep[2];
  uVar3 = *(undefined8 *)dRep->rep;
  if (isPartition != 0) {
    uVar10 = (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3;
    uVar14 = (uint)uVar10;
    uVar12 = uVar14;
    if (seqStore->longLengthType == ZSTD_llt_literalLength) {
      uVar12 = seqStore->longLengthPos;
    }
    if (uVar14 != 0) {
      uVar13 = 0;
      do {
        psVar4 = seqStore->sequencesStart;
        bVar15 = psVar4[uVar13].litLength == 0;
        bVar16 = uVar12 != uVar13;
        uVar14 = psVar4[uVar13].offBase;
        if (uVar14 == 0) {
          __assert_fail("offBase > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xf4f,
                        "void ZSTD_seqStore_resolveOffCodes(repcodes_t *const, repcodes_t *const, const seqStore_t *const, const U32)"
                       );
        }
        if (uVar14 < 4) {
          UVar6 = ZSTD_resolveRepcodeToRawOffset(dRep->rep,uVar14,(uint)(bVar15 && bVar16));
          in_stack_ffffffffffffff80 = 0x1c4fd9;
          UVar7 = ZSTD_resolveRepcodeToRawOffset(cRep->rep,uVar14,(uint)(bVar15 && bVar16));
          if (UVar6 != UVar7) {
            if (UVar7 == 0) {
              __assert_fail("(cRawOffset)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0xf58,
                            "void ZSTD_seqStore_resolveOffCodes(repcodes_t *const, repcodes_t *const, const seqStore_t *const, const U32)"
                           );
            }
            psVar4[uVar13].offBase = UVar7 + 3;
          }
        }
        iVar9 = (int)in_stack_ffffffffffffff80;
        uVar8 = psVar4[uVar13].offBase;
        if (uVar8 < 4) {
          if (uVar8 == 0) {
            __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
          }
          uVar8 = uVar8 - (!bVar15 || !bVar16);
          if (uVar8 != 0) {
            if (uVar8 == 3) {
              UVar6 = dRep->rep[0] - 1;
            }
            else {
              UVar6 = dRep->rep[uVar8];
            }
            dRep->rep[2] = dRep->rep[(ulong)(uVar8 == 1) + 1];
            dRep->rep[1] = dRep->rep[0];
            goto LAB_001c5057;
          }
        }
        else {
          *(undefined8 *)(dRep->rep + 1) = *(undefined8 *)dRep->rep;
          UVar6 = uVar8 - 3;
LAB_001c5057:
          dRep->rep[0] = UVar6;
        }
        if (uVar14 < 4) {
          uVar14 = uVar14 - (!bVar15 || !bVar16);
          if (uVar14 != 0) {
            if (uVar14 == 3) {
              UVar6 = cRep->rep[0] - 1;
            }
            else {
              UVar6 = cRep->rep[uVar14];
            }
            cRep->rep[2] = cRep->rep[(ulong)(uVar14 == 1) + 1];
            cRep->rep[1] = cRep->rep[0];
            goto LAB_001c50a3;
          }
        }
        else {
          *(undefined8 *)(cRep->rep + 1) = *(undefined8 *)cRep->rep;
          UVar6 = uVar14 - 3;
LAB_001c50a3:
          cRep->rep[0] = UVar6;
        }
        uVar13 = uVar13 + 1;
      } while ((uVar10 & 0xffffffff) != uVar13);
    }
  }
  uVar10 = 0xffffffffffffffba;
  if (2 < dstCapacity) {
    uVar10 = ZSTD_entropyCompressSeqStore
                       (seqStore,&((zc->blockState).prevCBlock)->entropy,
                        &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                        (void *)((long)dst + 3),dstCapacity - 3,srcSize,zc->entropyWorkspace,
                        (ulong)(uint)zc->bmi2,iVar9);
    if (uVar10 < 0xffffffffffffff89) {
      sVar11 = uVar10;
      if ((uVar10 < 0x19) && (zc->isFirstBlock == 0)) {
        iVar9 = ZSTD_isRLE((BYTE *)src,srcSize);
        sVar11 = 1;
        if (iVar9 == 0) {
          sVar11 = uVar10;
        }
      }
      if ((zc->seqCollector).collectSequences == 0) {
        if (sVar11 == 1) {
          if (dstCapacity == 3) {
            return 0xffffffffffffffba;
          }
          uVar1 = *src;
          iVar9 = lastBlock + (int)srcSize * 8 + 2;
          *(short *)dst = (short)iVar9;
          *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
          *(undefined1 *)((long)dst + 3) = uVar1;
          uVar10 = 4;
          dRep->rep[2] = UVar2;
          *(undefined8 *)dRep->rep = uVar3;
        }
        else if (sVar11 == 0) {
          uVar10 = 0xffffffffffffffba;
          if (srcSize + 3 <= dstCapacity) {
            iVar9 = lastBlock + (int)srcSize * 8;
            *(short *)dst = (short)iVar9;
            *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
            memcpy((void *)((long)dst + 3),src,srcSize);
            uVar10 = srcSize + 3;
          }
          if (0xffffffffffffff88 < uVar10) {
            return uVar10;
          }
          dRep->rep[2] = UVar2;
          *(undefined8 *)dRep->rep = uVar3;
        }
        else {
          pZVar5 = (zc->blockState).prevCBlock;
          (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
          (zc->blockState).nextCBlock = pZVar5;
          iVar9 = lastBlock + (int)sVar11 * 8 + 4;
          *(short *)dst = (short)iVar9;
          *(char *)((long)dst + 2) = (char)((uint)iVar9 >> 0x10);
          uVar10 = sVar11 + 3;
        }
        pZVar5 = (zc->blockState).prevCBlock;
        if ((pZVar5->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
          (pZVar5->entropy).fse.offcode_repeatMode = FSE_repeat_check;
        }
      }
      else {
        ZSTD_copyBlockSequences(zc);
        pZVar5 = (zc->blockState).prevCBlock;
        (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
        (zc->blockState).nextCBlock = pZVar5;
        uVar10 = 0;
      }
    }
  }
  return uVar10;
}

Assistant:

static size_t
ZSTD_compressSeqStore_singleBlock(ZSTD_CCtx* zc,
                            const seqStore_t* const seqStore,
                                  repcodes_t* const dRep, repcodes_t* const cRep,
                                  void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize,
                                  U32 lastBlock, U32 isPartition)
{
    const U32 rleMaxLength = 25;
    BYTE* op = (BYTE*)dst;
    const BYTE* ip = (const BYTE*)src;
    size_t cSize;
    size_t cSeqsSize;

    /* In case of an RLE or raw block, the simulated decompression repcode history must be reset */
    repcodes_t const dRepOriginal = *dRep;
    DEBUGLOG(5, "ZSTD_compressSeqStore_singleBlock");
    if (isPartition)
        ZSTD_seqStore_resolveOffCodes(dRep, cRep, seqStore, (U32)(seqStore->sequences - seqStore->sequencesStart));

    RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize, dstSize_tooSmall, "Block header doesn't fit");
    cSeqsSize = ZSTD_entropyCompressSeqStore(seqStore,
                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                &zc->appliedParams,
                op + ZSTD_blockHeaderSize, dstCapacity - ZSTD_blockHeaderSize,
                srcSize,
                zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                zc->bmi2);
    FORWARD_IF_ERROR(cSeqsSize, "ZSTD_entropyCompressSeqStore failed!");

    if (!zc->isFirstBlock &&
        cSeqsSize < rleMaxLength &&
        ZSTD_isRLE((BYTE const*)src, srcSize)) {
        /* We don't want to emit our first block as a RLE even if it qualifies because
        * doing so will cause the decoder (cli only) to throw a "should consume all input error."
        * This is only an issue for zstd <= v1.4.3
        */
        cSeqsSize = 1;
    }

    if (zc->seqCollector.collectSequences) {
        ZSTD_copyBlockSequences(zc);
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    if (cSeqsSize == 0) {
        cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "Nocompress block failed");
        DEBUGLOG(4, "Writing out nocompress block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else if (cSeqsSize == 1) {
        cSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, srcSize, lastBlock);
        FORWARD_IF_ERROR(cSize, "RLE compress block failed");
        DEBUGLOG(4, "Writing out RLE block, size: %zu", cSize);
        *dRep = dRepOriginal; /* reset simulated decompression repcode history */
    } else {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        writeBlockHeader(op, cSeqsSize, srcSize, lastBlock);
        cSize = ZSTD_blockHeaderSize + cSeqsSize;
        DEBUGLOG(4, "Writing out compressed block, size: %zu", cSize);
    }

    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}